

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNextElementSibling(xmlNodePtr node)

{
  xmlElementType xVar1;
  xmlNodePtr local_18;
  xmlNodePtr node_local;
  
  if ((node != (xmlNodePtr)0x0) &&
     ((((xVar1 = node->type, xVar1 == XML_ELEMENT_NODE || (xVar1 - XML_TEXT_NODE < 3)) ||
       (xVar1 - XML_PI_NODE < 2)) ||
      ((xVar1 == XML_DTD_NODE || (xVar1 == XML_XINCLUDE_START || xVar1 == XML_XINCLUDE_END)))))) {
    for (local_18 = node->next; local_18 != (xmlNodePtr)0x0; local_18 = local_18->next) {
      if (local_18->type == XML_ELEMENT_NODE) {
        return local_18;
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNextElementSibling(xmlNodePtr node) {
    if (node == NULL)
        return(NULL);
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DTD_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
            node = node->next;
            break;
        default:
            return(NULL);
    }
    while (node != NULL) {
        if (node->type == XML_ELEMENT_NODE)
            return(node);
        node = node->next;
    }
    return(NULL);
}